

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

bool __thiscall
clask::server_t::match
          (server_t *this,string *method,string *s,
          function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          *fn)

{
  pointer *this_00;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  _node *local_340;
  string local_328 [32];
  _node local_308;
  _node local_268;
  string local_1c8;
  reference local_1a8;
  _node *vv;
  iterator __end2;
  iterator __begin2;
  vector<clask::_node,_std::allocator<clask::_node>_> *__range2;
  string local_180 [7];
  bool found;
  string local_160 [32];
  long local_140;
  size_type pos;
  string sub;
  string local_108 [8];
  string ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  node n;
  function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *fn_local;
  string *s_local;
  string *method_local;
  server_t *this_local;
  
  n._152_8_ = fn;
  bVar1 = std::operator==(method,"GET");
  if (bVar1) {
    local_340 = &this->treeGET;
  }
  else {
    local_340 = &this->treePOST;
  }
  _node::_node((_node *)&args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&ss.field_2 + 8));
  std::__cxx11::string::string(local_108,(string *)s);
  std::__cxx11::string::string((string *)&pos);
  do {
    local_140 = std::__cxx11::string::find((char)local_108,0x2f);
    if (local_140 == -1) {
      std::__cxx11::string::substr((ulong)local_160,(ulong)local_108);
      std::__cxx11::string::operator=((string *)&pos,local_160);
      std::__cxx11::string::~string(local_160);
      local_140 = std::__cxx11::string::size();
    }
    else {
      std::__cxx11::string::substr((ulong)local_180,(ulong)local_108);
      std::__cxx11::string::operator=((string *)&pos,local_180);
      std::__cxx11::string::~string(local_180);
    }
    bVar1 = false;
    this_00 = &args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<clask::_node,_std::allocator<clask::_node>_>::begin
                       ((vector<clask::_node,_std::allocator<clask::_node>_> *)this_00);
    vv = (_node *)std::vector<clask::_node,_std::allocator<clask::_node>_>::end
                            ((vector<clask::_node,_std::allocator<clask::_node>_> *)this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                                       *)&vv), bVar2) {
      local_1a8 = __gnu_cxx::
                  __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>
                  ::operator*(&__end2);
      if ((local_1a8->placeholder & 1U) != 0) {
        url_decode(&local_1c8,(string *)&pos);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (ss.field_2._M_local_buf + 8),&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        _node::_node(&local_268,local_1a8);
        _node::operator=((_node *)&args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_268);
        _node::~_node(&local_268);
        bVar1 = true;
        break;
      }
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) != 0) ||
         (_Var3 = std::operator==(&local_1a8->name,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&pos), _Var3)) {
        _node::_node(&local_308,local_1a8);
        _node::operator=((_node *)&args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_308);
        _node::~_node(&local_308);
        bVar1 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<clask::_node_*,_std::vector<clask::_node,_std::allocator<clask::_node>_>_>::
      operator++(&__end2);
    }
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0011e55c;
    }
    std::__cxx11::string::substr((ulong)local_328,(ulong)local_108);
    std::__cxx11::string::operator=(local_108,local_328);
    std::__cxx11::string::~string(local_328);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) != 0) ||
       (bVar1 = std::vector<clask::_node,_std::allocator<clask::_node>_>::empty
                          ((vector<clask::_node,_std::allocator<clask::_node>_> *)
                           &args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      std::
      function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()((function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                    *)n._152_8_,(_func_t *)((long)&n.name.field_2 + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&ss.field_2 + 8));
      this_local._7_1_ = true;
LAB_0011e55c:
      std::__cxx11::string::~string((string *)&pos);
      std::__cxx11::string::~string(local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&ss.field_2 + 8));
      _node::~_node((_node *)&args.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return this_local._7_1_;
    }
  } while( true );
}

Assistant:

inline bool server_t::match(const std::string& method, const std::string& s, const std::function<void(const func_t& fn, const std::vector<std::string>&)>& fn) const {
  node n = method == "GET" ? treeGET : treePOST;
  std::vector<std::string> args;
  auto ss = s;
  std::string sub;
  while (true) {
    auto pos = ss.find('/', 1);

    if (pos == std::string::npos) {
      sub = ss.substr(1);
      pos = ss.size();
    } else {
      sub = ss.substr(1, pos - 1);
    }
    bool found = false;
    for (const auto& vv : n.children) {
      if (vv.placeholder) {
        args.emplace_back(url_decode(sub));
        n = node(vv);
        found = true;
        break;
      } else if (vv.name.empty() || vv.name == sub) {
        n = node(vv);
        found = true;
        break;
      }
    }
    if (!found)
      break;
    ss = ss.substr(pos);
    if (ss.empty() || n.children.empty()) {
      fn(n.fn, args);
      return true;
    }
  }
  return false;
}